

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O3

int decode_nal_units(HEVCContext *h,uint8_t *bs,uint64_t bs_len)

{
  ulong uVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  uint8_t uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  long lVar9;
  uint8_t *__dest;
  int iVar10;
  uint uVar11;
  
  if (bs_len < 4) {
    return 0;
  }
  uVar7 = 3;
  uVar4 = 0;
  do {
    lVar9 = (long)(int)uVar4;
    while (((bs[lVar9] != '\0' || (bs[lVar9 + 1] != '\0')) || (bs[lVar9 + 2] != '\x01'))) {
      uVar7 = lVar9 + 4;
      lVar9 = lVar9 + 1;
      if (bs_len <= uVar7) {
        return 0;
      }
    }
    h->nal_unit_type = bs[uVar7] >> 1 & (NAL_VPS|NAL_BLA_W_LP|NAL_RASL_N|NAL_RADL_R);
    iVar10 = (int)lVar9;
    uVar11 = iVar10 + 5;
    h->temporal_id = (bs[(long)iVar10 + 4] & 7) - 1;
    uVar4 = uVar11;
    if ((ulong)(long)(iVar10 + 8) < bs_len) {
      uVar7 = (ulong)uVar11;
      do {
        uVar3 = (uint)uVar7;
        if (bs[(int)uVar3] == '\0') {
          uVar4 = uVar11;
          if (uVar11 != uVar3) {
            uVar4 = uVar3 - (bs[(long)(int)uVar3 + -1] == '\0');
          }
          uVar7 = (long)(int)uVar4 + 2;
          if (((uVar7 < bs_len) && (bs[(long)(int)uVar4 + 1] == '\0')) && (bs[uVar7] < 4)) {
            if (bs[uVar7] != 3) {
              iVar10 = uVar4 - uVar11;
              puVar8 = bs + (int)uVar11;
              __dest = puVar8;
              if (iVar10 != -1) goto LAB_00104727;
              goto LAB_001045b3;
            }
            break;
          }
        }
        else {
          uVar7 = (ulong)(uVar3 + 2);
        }
        uVar4 = (uint)uVar7;
      } while ((ulong)(long)(int)(uVar4 + 3) < bs_len);
    }
    puVar8 = bs + (int)uVar11;
LAB_001045b3:
    lVar9 = bs_len - (long)(int)uVar11;
    uVar7 = lVar9 + 0x10;
    __dest = h->rbsp_buffer;
    if (h->rbsp_buffer_size < uVar7) {
      if (__dest != (uint8_t *)0x0) {
        free(__dest + -(long)(char)__dest[-1]);
      }
      if (lVar9 - 0x7fffffd0U < 0xffffffff80000021) {
        __dest = (uint8_t *)0x0;
      }
      else {
        pvVar5 = malloc(lVar9 + 0x30);
        if (pvVar5 == (void *)0x0) {
          __dest = (uint8_t *)0x0;
        }
        else {
          __dest = (uint8_t *)((long)pvVar5 + 0x20U & 0xffffffffffffffe0);
          __dest[-1] = ((byte)((long)pvVar5 + 0x20U) & 0xe0) - (char)pvVar5;
        }
      }
      h->rbsp_buffer = __dest;
      if (__dest == (uint8_t *)0x0) {
        uVar7 = 0;
      }
      h->rbsp_buffer_size = uVar7;
    }
    if (__dest == (uint8_t *)0x0) {
      decode_nal_units_cold_1();
      return -1;
    }
    iVar10 = uVar4 - uVar11;
    memcpy(__dest,puVar8,(long)iVar10);
    while( true ) {
      uVar11 = uVar4 + 2;
      if (bs_len <= (ulong)(long)(int)uVar11) break;
      uVar6 = bs[(int)uVar4];
      if (bs[(int)uVar11] < 4) {
        if (uVar6 != '\0') goto LAB_001046cc;
        if (bs[(long)(int)uVar4 + 1] != '\0') {
          uVar6 = '\0';
          goto LAB_001046cc;
        }
        if (bs[(int)uVar11] != 3) goto LAB_00104727;
        (__dest + iVar10)[0] = '\0';
        (__dest + iVar10)[1] = '\0';
        iVar10 = iVar10 + 2;
        uVar4 = uVar4 + 3;
      }
      else {
        __dest[iVar10] = uVar6;
        __dest[(long)iVar10 + 1] = bs[(long)(int)uVar4 + 1];
        uVar6 = bs[(int)uVar11];
        iVar10 = iVar10 + 2;
        uVar4 = uVar11;
LAB_001046cc:
        uVar4 = uVar4 + 1;
        lVar9 = (long)iVar10;
        iVar10 = iVar10 + 1;
        __dest[lVar9] = uVar6;
      }
    }
    uVar7 = (ulong)(int)uVar4;
    if (uVar7 < bs_len) {
      puVar8 = __dest + iVar10;
      iVar10 = (iVar10 + (int)bs_len) - uVar4;
      do {
        puVar2 = bs + uVar7;
        uVar7 = uVar7 + 1;
        *puVar8 = *puVar2;
        puVar8 = puVar8 + 1;
      } while (uVar7 < bs_len);
      uVar4 = (uint)uVar7;
    }
LAB_00104727:
    uVar11 = iVar10 * 8 + 8;
    uVar7 = (long)iVar10 + 1;
    do {
      if (uVar7 == 1) {
        (h->gb).buffer = __dest;
        (h->gb).size_in_bits = 0;
        (h->gb).size_in_bits_plus8 = 8;
        goto LAB_001047a7;
      }
      uVar1 = uVar7 - 1;
      uVar11 = uVar11 - 8;
      lVar9 = uVar7 - 2;
      uVar7 = uVar1;
    } while (__dest[lVar9] == '\0');
    if (0xfffffff < uVar1) {
      uVar11 = 0xfffffff8;
    }
    if (0x7ffffff7 < uVar11) {
      __dest = (uint8_t *)0x0;
      uVar11 = 0;
    }
    (h->gb).buffer = __dest;
    (h->gb).size_in_bits = uVar11;
    (h->gb).size_in_bits_plus8 = uVar11 + 8;
    __dest = __dest + ((int)uVar11 >> 3);
LAB_001047a7:
    (h->gb).buffer_end = __dest;
    (h->gb).index = 0;
    decode_nal_unit(h);
    uVar7 = (ulong)(int)(uVar4 + 3);
    if (bs_len <= uVar7) {
      return 0;
    }
  } while( true );
}

Assistant:

int decode_nal_units(HEVCContext *h, const uint8_t *bs, uint64_t bs_len)
{
    //decode all NAL units in an Access Unit
    int ptr_bs = 0;
    while(1)
    {
        //1. parse NAL start code
        while(ptr_bs + 3 < bs_len)
        {
            if(bs[ptr_bs] == 0 && bs[ptr_bs + 1] == 0 && bs[ptr_bs + 2] == 1)
                break;
            ptr_bs++;
        }
        if(ptr_bs + 3 >= bs_len)
            break;
        ptr_bs += 3;

        //2. NAL Unit header
        h->nal_unit_type = (enum NALUnitType)((bs[ptr_bs++] & 0x7F) >> 1);
        h->temporal_id = (bs[ptr_bs++] & 0x7) - 1;

        //3. Extract emulated code
        int ptr_bs_back = ptr_bs;
        int nalu_length = -1;
        while(ptr_bs + 3 < bs_len)
        {
            if(bs[ptr_bs])
            {
                ptr_bs += 2;
                continue;
            }
            if(ptr_bs != ptr_bs_back && !bs[ptr_bs - 1])
                ptr_bs--;
            if(ptr_bs + 2 < bs_len && bs[ptr_bs + 1] == 0 && bs[ptr_bs + 2] <= 3)
            {
                if(bs[ptr_bs + 2] != 3)
                    nalu_length = ptr_bs - ptr_bs_back;
                break;
            }
            ptr_bs += 2;
        }
        uint8_t *rbsp = (uint8_t *)(bs + ptr_bs_back);
        int rbsp_len = nalu_length;

        //4. Has 0x000003, very rare
        if(nalu_length == -1)
        {
            fd_fast_realloc((void **)&h->rbsp_buffer, &h->rbsp_buffer_size, bs_len - ptr_bs_back + 16);
            if(!h->rbsp_buffer)
            {
                fprintf(stderr, "Error Alloc memory for RBSP\n");
                return -1;
            }
            rbsp = h->rbsp_buffer;
            memcpy(rbsp, bs + ptr_bs_back, ptr_bs - ptr_bs_back);
            int si = ptr_bs;
            int di = ptr_bs - ptr_bs_back;
            while(si + 2 < bs_len)
            {
                if(bs[si + 2] > 3)
                {
                    rbsp[di++] = bs[si++];
                    rbsp[di++] = bs[si++];
                }
                else if(bs[si] == 0 && bs[si + 1] == 0)
                {
                    if(bs[si + 2] == 3)
                    {
                        rbsp[di++] = 0;
                        rbsp[di++] = 0;
                        si += 3;
                        continue;
                    }
                    goto nsc;
                }
                rbsp[di++] = bs[si++];
            }
            while(si < bs_len)
                rbsp[di++] = bs[si++];
nsc:
            rbsp_len = di;
            ptr_bs = si;
        }
//        for(int i = 0; i < rbsp_len; i++)
//            printf("%02x\n", rbsp[i]);

        while(rbsp_len && rbsp[rbsp_len - 1] == 0)
            rbsp_len--;
        //5. Initial get bits context
        init_get_bits8(&h->gb, rbsp, rbsp_len);

        //6. Decode this NAL Unit with this RBSP.
        decode_nal_unit(h);
    }
    return 0;
}